

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt,int i,sqlite3_uint64 n)

{
  int iVar1;
  int rc;
  sqlite3 *db;
  
  db = *(sqlite3 **)pStmt;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    db = *(sqlite3 **)pStmt;
  }
  rc = 0x12;
  if (n <= (ulong)(long)db->aLimit[0]) {
    rc = sqlite3_bind_zeroblob(pStmt,i,(int)n);
    db = *(sqlite3 **)pStmt;
    if ((rc == 0) && (iVar1 = 0, db->mallocFailed == '\0')) goto LAB_00124a5e;
  }
  iVar1 = apiHandleError(db,rc);
  db = *(sqlite3 **)pStmt;
LAB_00124a5e:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt, int i, sqlite3_uint64 n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  sqlite3_mutex_enter(p->db->mutex);
  if( n>(u64)p->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    rc = SQLITE_TOOBIG;
  }else{
    assert( (n & 0x7FFFFFFF)==n );
    rc = sqlite3_bind_zeroblob(pStmt, i, n);
  }
  rc = sqlite3ApiExit(p->db, rc);
  sqlite3_mutex_leave(p->db->mutex);
  return rc;
}